

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O1

bool __thiscall DyndepLoader::LoadDyndeps(DyndepLoader *this,Node *node,DyndepFile *ddf,string *err)

{
  Edge *edge;
  long lVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  long *plVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  pointer ppEVar8;
  _Rb_tree_header *p_Var9;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  DyndepFile *local_38;
  
  node->dyndep_pending_ = false;
  if (g_explaining == true) {
    LoadDyndeps();
  }
  bVar2 = LoadDyndepFile(this,node,ddf,err);
  if (bVar2) {
    ppEVar8 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppEVar8 !=
        (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      p_Var9 = &(ddf->
                super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                )._M_t._M_impl.super__Rb_tree_header;
      local_38 = ddf;
      do {
        edge = *ppEVar8;
        bVar2 = false;
        if (edge->dyndep_ == node) {
          p_Var7 = (ddf->
                   super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                   )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var3 = &p_Var9->_M_header;
          for (; p_Var7 != (_Base_ptr)0x0;
              p_Var7 = (&p_Var7->_M_left)[*(Edge **)(p_Var7 + 1) < edge]) {
            if (*(Edge **)(p_Var7 + 1) >= edge) {
              p_Var3 = p_Var7;
            }
          }
          p_Var7 = &p_Var9->_M_header;
          if (((_Rb_tree_header *)p_Var3 != p_Var9) &&
             (p_Var7 = p_Var3, edge < *(Edge **)(p_Var3 + 1))) {
            p_Var7 = &p_Var9->_M_header;
          }
          if ((_Rb_tree_header *)p_Var7 == p_Var9) {
            std::operator+(&local_58,"\'",
                           &(*(edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_start)->path_);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
            local_b8 = &local_a8;
            plVar6 = plVar5 + 2;
            if ((long *)*plVar5 == plVar6) {
              local_a8 = *plVar6;
              lStack_a0 = plVar5[3];
            }
            else {
              local_a8 = *plVar6;
              local_b8 = (long *)*plVar5;
            }
            local_b0 = plVar5[1];
            *plVar5 = (long)plVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_b8,(ulong)(node->path_)._M_dataplus._M_p);
            ddf = local_38;
            local_98 = &local_88;
            plVar6 = plVar5 + 2;
            if ((long *)*plVar5 == plVar6) {
              local_88 = *plVar6;
              lStack_80 = plVar5[3];
            }
            else {
              local_88 = *plVar6;
              local_98 = (long *)*plVar5;
            }
            local_90 = plVar5[1];
            *plVar5 = (long)plVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
            plVar6 = plVar5 + 2;
            if ((long *)*plVar5 == plVar6) {
              local_68 = *plVar6;
              lStack_60 = plVar5[3];
              local_78 = &local_68;
            }
            else {
              local_68 = *plVar6;
              local_78 = (long *)*plVar5;
            }
            local_70 = plVar5[1];
            *plVar5 = (long)plVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::operator=((string *)err,(string *)&local_78);
            if (local_78 != &local_68) {
              operator_delete(local_78,local_68 + 1);
            }
            if (local_98 != &local_88) {
              operator_delete(local_98,local_88 + 1);
            }
            if (local_b8 != &local_a8) {
              operator_delete(local_b8,local_a8 + 1);
            }
            this = (DyndepLoader *)local_58._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            bVar2 = true;
          }
          else {
            *(undefined1 *)&p_Var7[1]._M_parent = 1;
            bVar2 = UpdateEdge(this,edge,(Dyndeps *)&p_Var7[1]._M_parent,err);
            bVar2 = !bVar2;
          }
        }
        if (bVar2) goto LAB_0010e715;
        ppEVar8 = ppEVar8 + 1;
      } while (ppEVar8 !=
               (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    p_Var4 = (ddf->
             super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
             )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &(ddf->
              super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
              )._M_t._M_impl.super__Rb_tree_header;
    bVar2 = (_Rb_tree_header *)p_Var4 == p_Var9;
    if (!bVar2) {
      if (*(char *)&p_Var4[1]._M_parent == '\x01') {
        do {
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
          bVar2 = (_Rb_tree_header *)p_Var4 == p_Var9;
          if (bVar2) {
            return bVar2;
          }
        } while (*(char *)&p_Var4[1]._M_parent != '\0');
      }
      lVar1 = *(long *)(p_Var4 + 1);
      std::operator+(&local_58,"dyndep file \'",&node->path_);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_a8 = *plVar6;
        lStack_a0 = plVar5[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar6;
        local_b8 = (long *)*plVar5;
      }
      local_b0 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b8,*(ulong *)**(undefined8 **)(lVar1 + 0x28));
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_88 = *plVar6;
        lStack_80 = plVar5[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar6;
        local_98 = (long *)*plVar5;
      }
      local_90 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_68 = *plVar6;
        lStack_60 = plVar5[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar6;
        local_78 = (long *)*plVar5;
      }
      local_70 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
LAB_0010e715:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool DyndepLoader::LoadDyndeps(Node* node, DyndepFile* ddf,
                               std::string* err) const {
  // We are loading the dyndep file now so it is no longer pending.
  node->set_dyndep_pending(false);

  // Load the dyndep information from the file.
  EXPLAIN("loading dyndep file '%s'", node->path().c_str());
  if (!LoadDyndepFile(node, ddf, err))
    return false;

  // Update each edge that specified this node as its dyndep binding.
  std::vector<Edge*> const& out_edges = node->out_edges();
  for (std::vector<Edge*>::const_iterator oe = out_edges.begin();
       oe != out_edges.end(); ++oe) {
    Edge* const edge = *oe;
    if (edge->dyndep_ != node)
      continue;

    DyndepFile::iterator ddi = ddf->find(edge);
    if (ddi == ddf->end()) {
      *err = ("'" + edge->outputs_[0]->path() + "' "
              "not mentioned in its dyndep file "
              "'" + node->path() + "'");
      return false;
    }

    ddi->second.used_ = true;
    Dyndeps const& dyndeps = ddi->second;
    if (!UpdateEdge(edge, &dyndeps, err)) {
      return false;
    }
  }

  // Reject extra outputs in dyndep file.
  for (DyndepFile::const_iterator oe = ddf->begin(); oe != ddf->end();
       ++oe) {
    if (!oe->second.used_) {
      Edge* const edge = oe->first;
      *err = ("dyndep file '" + node->path() + "' mentions output "
              "'" + edge->outputs_[0]->path() + "' whose build statement "
              "does not have a dyndep binding for the file");
      return false;
    }
  }

  return true;
}